

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O2

size_t google::protobuf::internal::(anonymous_namespace)::
       MapValueByteSizeLong<google::protobuf::internal::MapDynamicFieldEnumValueInfo<google::protobuf::MapValueRef_const>>
                 (Type type,MapDynamicFieldEnumValueInfo<const_google::protobuf::MapValueRef> info)

{
  long lVar1;
  uint uVar2;
  undefined4 in_register_0000003c;
  
  uVar2 = MapValueConstRef::GetEnumValue((MapValueConstRef *)CONCAT44(in_register_0000003c,type));
  lVar1 = 0x3f;
  if ((long)(int)(uVar2 | 1) != 0) {
    for (; (ulong)(long)(int)(uVar2 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  return (ulong)((int)lVar1 * 9 + 0x49U >> 6);
}

Assistant:

inline size_t MapValueByteSizeLong(FieldDescriptor::Type type, InfoT info) {
  // There is a bug in GCC 9.5 where if-constexpr arguments are not understood
  // if passed into a helper function. A reproduction of the bug can be found
  // at: https://godbolt.org/z/65qW3vGhP
  // This is fixed in GCC 10.1+.
  (void)type;  // Suppress -Wunused-but-set-parameter

  if constexpr (info.cpp_type == FieldDescriptor::CPPTYPE_STRING) {
    return WireFormatLite::StringSize(info.Get());
  } else if constexpr (info.cpp_type == FieldDescriptor::CPPTYPE_MESSAGE) {
    ABSL_CHECK_NE(type, FieldDescriptor::TYPE_GROUP);
    return WireFormatLite::MessageSize(info.Get());
  } else {
    return MapPrimitiveFieldByteSize<info.cpp_type>(type, info.Get());
  }
}